

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void help(void)

{
  fwrite("-F [filename] Aggregate Full Uncertainty\n",0x29,1,_stderr);
  fwrite("-W [filename] Aggregate Wheatsheaf\n",0x23,1,_stderr);
  fwrite("-S [filename] Aggregate sample mean\n",0x24,1,_stderr);
  fwrite("-M [filename] Aggregate Wheatsheaf mean\n",0x28,1,_stderr);
  fwrite("-f [filename] Occurrence Full Uncertainty\n",0x2a,1,_stderr);
  fwrite("-w [filename] Occurrence Wheatsheaf\n",0x24,1,_stderr);
  fwrite("-s [filename] Occurrence sample mean\n",0x25,1,_stderr);
  fwrite("-m [filename] Occurrence Wheatsheaf mean\n",0x29,1,_stderr);
  fwrite("-K [directory] workspace sub folder\n",0x24,1,_stderr);
  fwrite("-r use return period file\n",0x1a,1,_stderr);
  fwrite("-H Skip header\n",0xf,1,_stderr);
  fwrite("-h help\n",8,1,_stderr);
  fwrite("-v version\n",0xb,1,_stderr);
  return;
}

Assistant:

void help()
{
	fprintf(stderr, "-F [filename] Aggregate Full Uncertainty\n");
	fprintf(stderr, "-W [filename] Aggregate Wheatsheaf\n");
	fprintf(stderr, "-S [filename] Aggregate sample mean\n");
	fprintf(stderr, "-M [filename] Aggregate Wheatsheaf mean\n");
	fprintf(stderr, "-f [filename] Occurrence Full Uncertainty\n");
	fprintf(stderr, "-w [filename] Occurrence Wheatsheaf\n");
	fprintf(stderr, "-s [filename] Occurrence sample mean\n");
	fprintf(stderr, "-m [filename] Occurrence Wheatsheaf mean\n");
	fprintf(stderr, "-K [directory] workspace sub folder\n");
	fprintf(stderr, "-r use return period file\n");
	fprintf(stderr, "-H Skip header\n");
	fprintf(stderr, "-h help\n");
	fprintf(stderr, "-v version\n");
}